

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzx_compress.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  undefined1 local_68 [8];
  string raw;
  string compressed;
  
  if (argc == 3) {
    raw._M_dataplus._M_p = (pointer)0x0;
    raw._M_string_length._0_1_ = 0;
    local_68 = (undefined1  [8])&raw._M_string_length;
    bVar1 = mg::fs::read_file(argv[1],(string *)local_68);
    iVar2 = -1;
    if (bVar1) {
      compressed._M_dataplus._M_p = (pointer)0x0;
      compressed._M_string_length._0_1_ = 0;
      raw.field_2._8_8_ = &compressed._M_string_length;
      bVar1 = mg::data::mzx_compress((string *)local_68,(string *)((long)&raw.field_2 + 8),true);
      if (bVar1) {
        bVar1 = mg::fs::write_file(argv[2],(string *)((long)&raw.field_2 + 8));
        iVar2 = bVar1 - 1;
      }
      else {
        main_cold_2();
      }
      if ((size_type *)raw.field_2._8_8_ != &compressed._M_string_length) {
        operator_delete((void *)raw.field_2._8_8_,
                        CONCAT71(compressed._M_string_length._1_7_,
                                 (undefined1)compressed._M_string_length) + 1);
      }
    }
    if (local_68 != (undefined1  [8])&raw._M_string_length) {
      operator_delete((void *)local_68,
                      CONCAT71(raw._M_string_length._1_7_,(undefined1)raw._M_string_length) + 1);
    }
  }
  else {
    main_cold_1();
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char **argv) {
  if (argc != 3) {
    fprintf(stderr, "%s infile outfile\n", argv[0]);
    return -1;
  }

  // Read input file
  std::string raw;
  if (!mg::fs::read_file(argv[1], raw)) {
    return -1;
  }

  // Decompress
  std::string compressed;
  if (!mg::data::mzx_compress(raw, compressed)) {
    fprintf(stderr, "Compress failed\n");
    return -1;
  }

  // Emit
  if (!mg::fs::write_file(argv[2], compressed)) {
    return -1;
  }

  return 0;
}